

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::DynArrayDeleteMethod::eval
          (DynArrayDeleteMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  Type *pTVar2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  EvalContext *in_RDI;
  ConstantValue *in_R8;
  LValue *in_R9;
  LValue lval;
  nullptr_t in_stack_fffffffffffffde8;
  EvalContext *this_00;
  
  this_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::evalLValue((Expression *)this_00,in_RDI);
  bVar1 = LValue::operator_cast_to_bool((LValue *)0x132fc21);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
    pTVar2 = not_null<const_slang::ast::Type_*>::operator->
                       ((not_null<const_slang::ast::Type_*> *)0x132fc7e);
    Type::getDefaultValue((Type *)this_00);
    LValue::store(in_R9,in_R8);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x132fcaf);
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,pTVar2);
  }
  else {
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,in_stack_fffffffffffffde8);
  }
  LValue::~LValue((LValue *)0x132fced);
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lval = args[0]->evalLValue(context);
        if (!lval)
            return nullptr;

        lval.store(args[0]->type->getDefaultValue());
        return nullptr;
    }